

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_2> __thiscall
tcu::faceForward<double,2>
          (tcu *this,Vector<double,_2> *n,Vector<double,_2> *i,Vector<double,_2> *ref)

{
  double dVar1;
  double extraout_XMM0_Qa;
  Vector<double,_2> VVar2;
  Vector<double,_2> VVar3;
  Vector<double,_2> *ref_local;
  Vector<double,_2> *i_local;
  Vector<double,_2> *n_local;
  
  dVar1 = dot<double,2>(ref,i);
  if (0.0 <= dVar1) {
    VVar2 = operator-(this,n);
  }
  else {
    Vector<double,_2>::Vector((Vector<double,_2> *)this,n);
    VVar2.m_data[1] = dVar1;
    VVar2.m_data[0] = extraout_XMM0_Qa;
  }
  VVar3.m_data[0] = VVar2.m_data[0];
  VVar3.m_data[1] = VVar2.m_data[1];
  return (Vector<double,_2>)VVar3.m_data;
}

Assistant:

inline Vector<T, Size> faceForward (const Vector<T, Size>& n, const Vector<T, Size>& i, const Vector<T, Size>& ref)
{
	return (dot(ref, i) < T(0)) ? n: -n;
}